

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O3

void __thiscall
LightMask::blur(LightMask *this,vector<float,_std::allocator<float>_> *from,
               vector<float,_std::allocator<float>_> *to,int rad)

{
  int iVar1;
  int iVar2;
  pointer pfVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  float fVar14;
  int local_78;
  long local_60;
  
  iVar1 = this->width_;
  lVar5 = (long)iVar1;
  if (rad < iVar1 - rad) {
    iVar4 = rad * 2 + 1;
    iVar2 = this->height_;
    pfVar3 = (to->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    lVar6 = (long)rad;
    local_78 = 0;
    iVar13 = iVar4;
    local_60 = lVar6;
    do {
      if (rad < iVar2 - rad) {
        iVar8 = 0;
        lVar7 = lVar6;
        do {
          fVar14 = 0.0;
          if (local_60 - lVar6 <= local_60 + lVar6) {
            pfVar9 = (float *)((long)(from->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start +
                              (long)iVar8 * lVar5 * 4 + (long)local_78 * 4);
            lVar11 = (long)local_78;
            do {
              pfVar12 = pfVar9;
              iVar10 = iVar4;
              if (lVar7 - lVar6 <= lVar7 + lVar6) {
                do {
                  fVar14 = fVar14 + *pfVar12;
                  pfVar12 = pfVar12 + lVar5;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
              }
              lVar11 = lVar11 + 1;
              pfVar9 = pfVar9 + 1;
            } while (iVar13 != (int)lVar11);
          }
          pfVar3[local_60 + lVar7 * lVar5] = fVar14 / (float)(iVar4 * iVar4);
          lVar7 = lVar7 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar2 + rad * -2);
      }
      local_60 = local_60 + 1;
      local_78 = local_78 + 1;
      iVar13 = iVar13 + 1;
    } while (local_78 != iVar1 + rad * -2);
  }
  return;
}

Assistant:

void blur(const std::vector<float>& from, std::vector<float>& to, int rad)
    {
        // number of tiles in the kernel
        const int numtiles = ((2 * rad) + 1) * ((2 * rad) + 1);

        //std::vector<float> blur(width*height, 0.0f);
        for (int i = rad; i < width_-rad; i++)
        {
            for (int j = rad; j < height_-rad; j++)
            {
                // Compute the sum of all values in the kernel
                float sum = 0.0f;
                for (int kx = i-rad; kx <= i+rad; kx++)
                {
                    for (int ky = j-rad; ky <= j+rad; ky++)
                    {
                        sum += from[kx + ky * width_];
                    }
                }

                // Average the value
                float avg = sum / numtiles;
                to[i + j * width_] = avg;
            }
        }
    }